

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p5_pbev2.cc
# Opt level: O3

int add_cipher_oid(CBB *out,int nid)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (*(int *)(kCipherOIDs[0].oid + lVar2 + 0xc) == nid) {
      iVar1 = CBB_add_asn1_element
                        (out,6,kCipherOIDs[0].oid + lVar2,(ulong)kCipherOIDs[0].oid[lVar2 + 9]);
      return iVar1;
    }
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x78);
  ERR_put_error(0x13,0,0x7f,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/p5_pbev2.cc"
                ,0x62);
  return 0;
}

Assistant:

static int add_cipher_oid(CBB *out, int nid) {
  for (const auto &cipher : kCipherOIDs) {
    if (cipher.nid == nid) {
      return CBB_add_asn1_element(out, CBS_ASN1_OBJECT, cipher.oid,
                                  cipher.oid_len);
    }
  }

  OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNSUPPORTED_CIPHER);
  return 0;
}